

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O1

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcTopologyRepresentation,_0UL>::
         Construct(DB *db,LIST *params)

{
  IfcRepresentation *in;
  
  in = (IfcRepresentation *)operator_new(0xb8);
  in[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)&PTR__Object_00806870;
  *(undefined8 *)
   &in[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x10 = 0;
  *(char **)&in[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.field_0x18 =
       "IfcTopologyRepresentation";
  Assimp::IFC::Schema_2x3::IfcShapeModel::IfcShapeModel
            ((IfcShapeModel *)in,&PTR_construction_vtable_24__0080a5b0);
  (in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcTopologyRepresentation_0080a520;
  in[1].super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>.aux_is_derived.
  super__Base_bitset<1UL>._M_w = (_WordT)&PTR__IfcTopologyRepresentation_0080a598;
  *(undefined ***)&in->field_0x80 = &PTR__IfcTopologyRepresentation_0080a548;
  *(undefined ***)&in->field_0x90 = &PTR__IfcTopologyRepresentation_0080a570;
  GenericFill<Assimp::IFC::Schema_2x3::IfcRepresentation>(db,params,in);
  return (Object *)
         ((long)&(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
                 _vptr_ObjectHelper +
         (long)(in->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentation,_4UL>).
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }